

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

_Bool skip_comp_based_on_var(uint (*single_vars) [8],BLOCK_SIZE bsize)

{
  uint local_2c;
  uint thresh_32;
  uint thresh_64;
  int ref_idx;
  int cur_mode_idx;
  uint best_var;
  BLOCK_SIZE bsize_local;
  uint (*single_vars_local) [8];
  _Bool local_1;
  
  best_var = 0xffffffff;
  for (cur_mode_idx = 0; cur_mode_idx < 4; cur_mode_idx = cur_mode_idx + 1) {
    for (ref_idx = 0; ref_idx < 8; ref_idx = ref_idx + 1) {
      if (best_var < single_vars[cur_mode_idx][ref_idx]) {
        local_2c = best_var;
      }
      else {
        local_2c = single_vars[cur_mode_idx][ref_idx];
      }
      best_var = local_2c;
    }
  }
  switch(bsize) {
  case BLOCK_16X16:
    local_1 = best_var < 0x100;
    break;
  default:
    local_1 = false;
    break;
  case BLOCK_32X32:
    local_1 = best_var < 0x401;
    break;
  case BLOCK_64X64:
    local_1 = best_var < 0x1366;
    break;
  case BLOCK_128X128:
    local_1 = best_var < 0x4d98;
  }
  return local_1;
}

Assistant:

static bool skip_comp_based_on_var(
    const unsigned int (*single_vars)[REF_FRAMES], BLOCK_SIZE bsize) {
  unsigned int best_var = UINT_MAX;
  for (int cur_mode_idx = 0; cur_mode_idx < RTC_INTER_MODES; cur_mode_idx++) {
    for (int ref_idx = 0; ref_idx < REF_FRAMES; ref_idx++) {
      best_var = AOMMIN(best_var, single_vars[cur_mode_idx][ref_idx]);
    }
  }
  const unsigned int thresh_64 = (unsigned int)(0.57356805f * 8659);
  const unsigned int thresh_32 = (unsigned int)(0.23964763f * 4281);

  // Currently, the thresh for 128 and 16 are not well-tuned. We are using the
  // results from 64 and 32 as an heuristic.
  switch (bsize) {
    case BLOCK_128X128: return best_var < 4 * thresh_64;
    case BLOCK_64X64: return best_var < thresh_64;
    case BLOCK_32X32: return best_var < thresh_32;
    case BLOCK_16X16: return best_var < thresh_32 / 4;
    default: return false;
  }
}